

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void do_queued_events(void)

{
  int iVar1;
  Fl_Window *window;
  XEvent xevent;
  XEvent XStack_c8;
  
  in_a_window = '\x01';
  iVar1 = XEventsQueued(fl_display);
  while (iVar1 != 0) {
    XNextEvent(fl_display,&XStack_c8);
    iVar1 = fl_send_system_handlers(&XStack_c8);
    if (iVar1 == 0) {
      fl_handle(&XStack_c8);
    }
    iVar1 = XEventsQueued(fl_display);
  }
  if (in_a_window == '\0') {
    iVar1 = 4;
    window = (Fl_Window *)0x0;
  }
  else {
    if (send_motion != fl_xmousewin) {
      return;
    }
    send_motion = (Fl_Window *)0x0;
    iVar1 = 0xb;
    window = fl_xmousewin;
  }
  Fl::handle(iVar1,window);
  return;
}

Assistant:

static void do_queued_events() {
  in_a_window = true;
  while (XEventsQueued(fl_display,QueuedAfterReading)) {
    XEvent xevent;
    XNextEvent(fl_display, &xevent);
    if (fl_send_system_handlers(&xevent))
      continue;
    fl_handle(xevent);
  }
  // we send FL_LEAVE only if the mouse did not enter some other window:
  if (!in_a_window) Fl::handle(FL_LEAVE, 0);
#if CONSOLIDATE_MOTION
  else if (send_motion == fl_xmousewin) {
    send_motion = 0;
    Fl::handle(FL_MOVE, fl_xmousewin);
  }
#endif
}